

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Alloc_hider _Var3;
  pointer pbVar4;
  pointer pbVar5;
  undefined4 uVar6;
  uint uVar7;
  OptionAdder *pOVar8;
  size_t sVar9;
  ostream *poVar10;
  ulong uVar11;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  long lVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  bool bVar14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool erase_old_mdsplit_files;
  bool trace;
  bool remove_autotoc;
  bool update_links;
  bool add_front_matter;
  bool indent_headers;
  bool jekyll_escape;
  bool include_toc;
  short max_split_level;
  bool show_help;
  bool show_version;
  string input;
  mdsplitter m;
  string output;
  string repository;
  ParseResult result;
  Options options;
  bool local_bf2;
  bool local_bf1;
  bool local_bf0;
  bool local_bef;
  bool local_bee;
  bool local_bed;
  bool local_bec;
  bool local_beb;
  short local_bea;
  undefined1 local_be8 [40];
  string local_bc0;
  string local_ba0;
  string local_b80;
  long *local_b60 [2];
  long local_b50 [2];
  string local_b40;
  string local_b20;
  element_type *local_b00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_af8;
  undefined1 local_af0 [16];
  string local_ae0;
  string local_ac0;
  long *local_aa0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a98;
  long local_a90 [2];
  int local_a7c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a78;
  string local_a60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a40;
  pointer local_a38;
  undefined1 local_a30 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a20;
  undefined1 local_a10 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a00;
  undefined1 local_9f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9d0;
  undefined1 local_9c0 [24];
  undefined1 local_9a8 [16];
  undefined1 local_998 [24];
  size_type local_980 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_970;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_948 [2];
  path local_928;
  vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_> local_900;
  __node_base local_8e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_8e0;
  element_type *local_8d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_8d0;
  element_type *local_8c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_8c0;
  element_type *local_8b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_8b0;
  element_type *local_8a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_8a0;
  element_type *local_898;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_890;
  element_type *local_888;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_880;
  element_type *local_878;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_870;
  element_type *local_868;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_860;
  element_type *local_858;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  string local_828;
  long *local_808 [2];
  long local_7f8 [2];
  string local_7e8;
  string local_7c8;
  long *local_7a8 [2];
  long local_798 [2];
  string local_788;
  string local_768;
  string local_748;
  long *local_728 [2];
  long local_718 [2];
  string local_708;
  string local_6e8;
  string local_6c8;
  long *local_6a8 [2];
  long local_698 [2];
  string local_688;
  string local_668;
  string local_648;
  long *local_628 [2];
  long local_618 [2];
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  undefined1 local_548 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_518;
  _Hashtable<std::shared_ptr<cxxopts::OptionDetails>,_std::pair<const_std::shared_ptr<cxxopts::OptionDetails>,_cxxopts::OptionValue>,_std::allocator<std::pair<const_std::shared_ptr<cxxopts::OptionDetails>,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<cxxopts::OptionDetails>_>,_std::hash<std::shared_ptr<cxxopts::OptionDetails>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_4e0;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_4a0;
  shared_ptr<const_cxxopts::Value> local_488;
  shared_ptr<const_cxxopts::Value> local_478;
  long *local_468;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_460;
  shared_ptr<const_cxxopts::Value> local_458;
  long *local_448;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_440;
  shared_ptr<const_cxxopts::Value> local_438;
  long *local_428;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_420;
  shared_ptr<const_cxxopts::Value> local_418;
  long *local_408;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_400;
  shared_ptr<const_cxxopts::Value> local_3f8;
  long *local_3e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3e0;
  shared_ptr<const_cxxopts::Value> local_3d8;
  long *local_3c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3c0;
  shared_ptr<const_cxxopts::Value> local_3b8;
  long *local_3a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3a0;
  shared_ptr<const_cxxopts::Value> local_398;
  long *local_388;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_380;
  shared_ptr<const_cxxopts::Value> local_378;
  long *local_368;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_360;
  shared_ptr<const_cxxopts::Value> local_358;
  long *local_348;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_340;
  shared_ptr<const_cxxopts::Value> local_338;
  shared_ptr<const_cxxopts::Value> local_328;
  shared_ptr<const_cxxopts::Value> local_318;
  shared_ptr<const_cxxopts::Value> local_308;
  char **local_2f8;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  long *local_290 [2];
  long local_280 [2];
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  long *local_170 [2];
  long local_160 [2];
  undefined1 local_150 [129];
  bool local_cf;
  element_type *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8 [5];
  
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"mdsplit","");
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b0,"Generate documentation from README.md files","");
  cxxopts::Options::Options((Options *)local_150,&local_190,&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  local_9e0._M_allocated_capacity = (size_type)&local_9d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_9f0 + 0x10),"README.md","");
  local_848._M_dataplus._M_p = (pointer)&local_848.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_848,"docs","");
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  local_568._M_string_length = 0;
  local_568.field_2._M_local_buf[0] = '\0';
  local_a00._M_allocated_capacity =
       (size_type)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_a10 + 0x10),"File","");
  uVar6 = local_9f0._0_4_;
  local_9c0._16_8_ = local_a00._8_8_;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_a00._M_allocated_capacity ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9f0) {
    local_538._M_string_length._0_4_ = local_9f0._8_4_;
    local_538._M_string_length._4_4_ = local_9f0._12_4_;
    local_548._0_8_ = &local_538;
  }
  else {
    local_548._0_8_ = local_a00._M_allocated_capacity;
  }
  local_538._M_dataplus._M_p._4_4_ = local_9f0._4_4_;
  local_538._M_dataplus._M_p._0_4_ = local_9f0._0_4_;
  local_548._8_8_ = local_a00._8_8_;
  local_a00._8_8_ = 0;
  local_9f0._0_4_ = local_9f0._0_4_ & 0xffffff00;
  local_9c0._8_8_ = local_9a8;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548._0_8_ ==
      &local_538) {
    local_9a8._0_8_ = CONCAT44(local_9f0._4_4_,uVar6);
    local_9a8._12_4_ = local_538._M_string_length._4_4_;
    local_9a8._8_4_ = (undefined4)local_538._M_string_length;
  }
  else {
    local_9c0._8_8_ = local_548._0_8_;
    local_9a8._0_8_ = local_538._M_dataplus._M_p;
  }
  local_a00._M_allocated_capacity =
       (size_type)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9f0;
  local_9c0._0_8_ = (Options *)local_150;
  local_548._0_8_ = &local_538;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"i,input","");
  pcVar1 = local_be8 + 0x10;
  local_be8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_be8,"Input file","");
  cxxopts::value<std::__cxx11::string>
            ((cxxopts *)&local_ac0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_9f0 + 0x10)
            );
  local_ba0._M_dataplus._M_p = (pointer)&local_ba0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ba0,"README.md","");
  (**(code **)(*(long *)local_ac0._M_dataplus._M_p + 0x50))
            (&local_b00,local_ac0._M_dataplus._M_p,&local_ba0);
  local_308.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_b00;
  local_308.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_af8;
  local_b00 = (element_type *)0x0;
  p_Stack_af8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
  pOVar8 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)local_9c0,(string *)local_548,(string *)local_be8,&local_308,
                      &local_1d0);
  local_bc0._M_dataplus._M_p = (pointer)&local_bc0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bc0,"o,output","");
  local_b80._M_dataplus._M_p = (pointer)&local_b80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b80,"Output directory","");
  cxxopts::value<std::__cxx11::string>((cxxopts *)&local_aa0,&local_848);
  local_b60[0] = local_b50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b60,"docs","");
  (**(code **)(*local_aa0 + 0x50))(local_af0 + 0x10,local_aa0,local_b60);
  local_318.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_ae0._M_dataplus._M_p;
  local_318.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ae0._M_string_length;
  local_ae0._M_dataplus._M_p = (pointer)0x0;
  local_ae0._M_string_length = 0;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_bc0,&local_b80,&local_318,&local_1f0);
  local_b20._M_dataplus._M_p = (pointer)&local_b20.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b20,"r,repository","");
  local_b40._M_dataplus._M_p = (pointer)&local_b40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b40,"Output repository","");
  cxxopts::value<std::__cxx11::string>((cxxopts *)&local_a60,&local_568);
  local_328.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_a60._M_dataplus._M_p;
  local_328.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a60._M_string_length;
  local_a60._M_dataplus._M_p = (pointer)0x0;
  local_a60._M_string_length = 0;
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
  cxxopts::OptionAdder::operator()(pOVar8,&local_b20,&local_b40,&local_328,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if (local_328.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_328.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a60._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a60._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b40._M_dataplus._M_p != &local_b40.field_2) {
    operator_delete(local_b40._M_dataplus._M_p,local_b40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b20._M_dataplus._M_p != &local_b20.field_2) {
    operator_delete(local_b20._M_dataplus._M_p,local_b20.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if (local_318.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_318.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ae0._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ae0._M_string_length);
  }
  if (local_b60[0] != local_b50) {
    operator_delete(local_b60[0],local_b50[0] + 1);
  }
  if (local_a98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b80._M_dataplus._M_p != &local_b80.field_2) {
    operator_delete(local_b80._M_dataplus._M_p,local_b80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bc0._M_dataplus._M_p != &local_bc0.field_2) {
    operator_delete(local_bc0._M_dataplus._M_p,local_bc0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if (local_308.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_308.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_af8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_af8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba0._M_dataplus._M_p != &local_ba0.field_2) {
    operator_delete(local_ba0._M_dataplus._M_p,local_ba0.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ac0._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ac0._M_string_length);
  }
  if ((pointer)local_be8._0_8_ != pcVar1) {
    operator_delete((void *)local_be8._0_8_,local_be8._16_8_ + 1);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548._0_8_ !=
      &local_538) {
    operator_delete((void *)local_548._0_8_,(ulong)(local_538._M_dataplus._M_p + 1));
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9c0._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9a8) {
    operator_delete((void *)local_9c0._8_8_,(ulong)(local_9a8._0_8_ + 1));
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_a00._M_allocated_capacity !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9f0) {
    operator_delete((void *)local_a00._M_allocated_capacity,
                    CONCAT44(local_9f0._4_4_,local_9f0._0_4_) + 1);
  }
  local_bea = 6;
  local_a78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_a78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_a78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_beb = false;
  local_bec = true;
  local_bed = true;
  local_bee = true;
  local_bef = true;
  local_bf0 = true;
  local_bf1 = true;
  local_bf2 = true;
  local_a40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a40,"Behaviour","");
  uVar6 = local_a30._0_4_;
  local_9c0._16_8_ = local_a38;
  if (local_a40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a30) {
    local_538._M_string_length._0_4_ = local_a30._8_4_;
    local_538._M_string_length._4_4_ = local_a30._12_4_;
    local_548._0_8_ = &local_538;
  }
  else {
    local_548._0_8_ = local_a40;
  }
  local_538._M_dataplus._M_p._4_4_ = local_a30._4_4_;
  local_538._M_dataplus._M_p._0_4_ = local_a30._0_4_;
  local_548._8_8_ = local_a38;
  local_a38 = (pointer)0x0;
  local_a30._0_4_ = local_a30._0_4_ & 0xffffff00;
  local_9c0._0_8_ = local_150;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548._0_8_ ==
      &local_538) {
    local_9a8._0_8_ = CONCAT44(local_a30._4_4_,uVar6);
    local_9a8._12_4_ = local_538._M_string_length._4_4_;
    local_9a8._8_4_ = (undefined4)local_538._M_string_length;
    local_9c0._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9a8
    ;
  }
  else {
    local_9c0._8_8_ = local_548._0_8_;
    local_9a8._0_8_ = local_538._M_dataplus._M_p;
  }
  local_a40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a30;
  local_548._0_8_ = &local_538;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"l,level","");
  local_be8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_be8,"Max level for which we should split the file","");
  cxxopts::value<short>((short *)&local_348);
  local_ba0._M_dataplus._M_p = (pointer)&local_ba0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ba0,"6","");
  (**(code **)(*local_348 + 0x50))(&local_858,local_348,&local_ba0);
  local_338.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_858;
  local_338.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_850;
  local_858 = (element_type *)0x0;
  p_Stack_850 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"");
  pOVar8 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)local_9c0,(string *)local_548,(string *)local_be8,&local_338,
                      &local_588);
  local_bc0._M_dataplus._M_p = (pointer)&local_bc0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bc0,"c,clear-html","");
  local_b80._M_dataplus._M_p = (pointer)&local_b80.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b80,"List of HTML tags mdsplit should clear","");
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((cxxopts *)&local_368,&local_a78);
  local_b60[0] = local_b50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b60,"details,summary","");
  (**(code **)(*local_368 + 0x50))(&local_868,local_368,local_b60);
  local_358.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_868;
  local_358.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_860;
  local_868 = (element_type *)0x0;
  p_Stack_860 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"");
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_bc0,&local_b80,&local_358,&local_5a8);
  local_b20._M_dataplus._M_p = (pointer)&local_b20.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b20,"t,toc","");
  local_b40._M_dataplus._M_p = (pointer)&local_b40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b40,"Create a table of contents for the new files","");
  cxxopts::value<bool>((cxxopts *)&local_388,&local_beb);
  local_b00 = (element_type *)local_af0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b00,"false","");
  (**(code **)(*local_388 + 0x50))(&local_878,local_388,&local_b00);
  local_378.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_878;
  local_378.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_870;
  local_878 = (element_type *)0x0;
  p_Stack_870 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"");
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_b20,&local_b40,&local_378,&local_5c8);
  local_ac0._M_dataplus._M_p = (pointer)&local_ac0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ac0,"e,erase-old-mdsplit-files","");
  local_ae0._M_dataplus._M_p = (pointer)&local_ae0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_af0 + 0x10),"Erase old md files also generated with mdsplit","");
  cxxopts::value<bool>((cxxopts *)&local_3a8,&local_bf2);
  local_aa0 = local_a90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_aa0,"true","");
  (**(code **)(*local_3a8 + 0x50))(&local_888,local_3a8,&local_aa0);
  local_398.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_888;
  local_398.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_880;
  local_888 = (element_type *)0x0;
  p_Stack_880 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"");
  pOVar8 = cxxopts::OptionAdder::operator()
                     (pOVar8,&local_ac0,(string *)(local_af0 + 0x10),&local_398,&local_5e8);
  local_a60._M_dataplus._M_p = (pointer)&local_a60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a60,"j,jekyll-escape","");
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_608,"Escape consecutive \"{{\"s for Jekyll processing","");
  cxxopts::value<bool>((cxxopts *)&local_3c8,&local_bec);
  local_628[0] = local_618;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"true","");
  (**(code **)(*local_3c8 + 0x50))(&local_898,local_3c8,local_628);
  local_3b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_898;
  local_3b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_890;
  local_898 = (element_type *)0x0;
  p_Stack_890 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"");
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_a60,&local_608,&local_3b8,&local_648);
  local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_668,"header-reindent","");
  local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_688,"Reindent headers to match the new files","");
  cxxopts::value<bool>((cxxopts *)&local_3e8,&local_bed);
  local_6a8[0] = local_698;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"true","");
  (**(code **)(*local_3e8 + 0x50))(&local_8a8,local_3e8,local_6a8);
  local_3d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_8a8;
  local_3d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_8a0;
  local_8a8 = (element_type *)0x0;
  p_Stack_8a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"");
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_668,&local_688,&local_3d8,&local_6c8);
  local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"f,front-matter","");
  local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_708,"Include a front-matter in the new files","");
  cxxopts::value<bool>((cxxopts *)&local_408,&local_bee);
  local_728[0] = local_718;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_728,"true","");
  (**(code **)(*local_408 + 0x50))(&local_8b8,local_408,local_728);
  local_3f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_8b8;
  local_3f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_8b0;
  local_8b8 = (element_type *)0x0;
  p_Stack_8b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,"");
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_6e8,&local_708,&local_3f8,&local_748);
  local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"u,url-update","");
  local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_788,"Update relative URLs to their new relative paths","");
  cxxopts::value<bool>((cxxopts *)&local_428,&local_bef);
  local_7a8[0] = local_798;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"true","");
  (**(code **)(*local_428 + 0x50))(&local_8c8,local_428,local_7a8);
  local_418.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_8c8;
  local_418.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_8c0;
  local_8c8 = (element_type *)0x0;
  p_Stack_8c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c8,"");
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_768,&local_788,&local_418,&local_7c8);
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"remove-auto-toc","");
  local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7e8,"Remove automatic table of contents","");
  cxxopts::value<bool>((cxxopts *)&local_448,&local_bf0);
  local_808[0] = local_7f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_808,"true","");
  (**(code **)(*local_448 + 0x50))(&local_8d8,local_448,local_808);
  local_438.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_8d8;
  local_438.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_8d0;
  local_8d8 = (element_type *)0x0;
  p_Stack_8d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"");
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_230,&local_7e8,&local_438,&local_250);
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"trace","");
  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_828,"Trace commands","");
  cxxopts::value<bool>((cxxopts *)&local_468,&local_bf1);
  local_290[0] = local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"true","");
  (**(code **)(*local_468 + 0x50))(&local_8e8,local_468,local_290);
  local_458.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_8e8._M_nxt;
  local_458.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_8e0;
  local_8e8._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_8e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"");
  cxxopts::OptionAdder::operator()(pOVar8,&local_270,&local_828,&local_458,&local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if (local_458.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_458.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_8e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_8e0);
  }
  if (local_290[0] != local_280) {
    operator_delete(local_290[0],local_280[0] + 1);
  }
  if (local_460 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_828._M_dataplus._M_p != &local_828.field_2) {
    operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = local_be8 + 0x10;
  if (local_438.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_438.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_8d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_8d0);
  }
  if (local_808[0] != local_7f8) {
    operator_delete(local_808[0],local_7f8[0] + 1);
  }
  if (local_440 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_440);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
    operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
  }
  if (local_418.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_418.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_8c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_8c0);
  }
  if (local_7a8[0] != local_798) {
    operator_delete(local_7a8[0],local_798[0] + 1);
  }
  if (local_420 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_420);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != &local_788.field_2) {
    operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768._M_dataplus._M_p != &local_768.field_2) {
    operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._M_dataplus._M_p != &local_748.field_2) {
    operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1);
  }
  if (local_3f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_8b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_8b0);
  }
  if (local_728[0] != local_718) {
    operator_delete(local_728[0],local_718[0] + 1);
  }
  if (local_400 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_400);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708._M_dataplus._M_p != &local_708.field_2) {
    operator_delete(local_708._M_dataplus._M_p,local_708.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
    operator_delete(local_6e8._M_dataplus._M_p,local_6e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
  }
  if (local_3d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_8a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_8a0);
  }
  if (local_6a8[0] != local_698) {
    operator_delete(local_6a8[0],local_698[0] + 1);
  }
  if (local_3e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_688._M_dataplus._M_p != &local_688.field_2) {
    operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_668._M_dataplus._M_p != &local_668.field_2) {
    operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648._M_dataplus._M_p != &local_648.field_2) {
    operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
  }
  if (local_3b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_890 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_890);
  }
  if (local_628[0] != local_618) {
    operator_delete(local_628[0],local_618[0] + 1);
  }
  if (local_3c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a60._M_dataplus._M_p != &local_a60.field_2) {
    operator_delete(local_a60._M_dataplus._M_p,local_a60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
  }
  if (local_398.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_398.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_880 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_880);
  }
  if (local_aa0 != local_a90) {
    operator_delete(local_aa0,local_a90[0] + 1);
  }
  if (local_3a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae0._M_dataplus._M_p != &local_ae0.field_2) {
    operator_delete(local_ae0._M_dataplus._M_p,local_ae0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._M_dataplus._M_p != &local_ac0.field_2) {
    operator_delete(local_ac0._M_dataplus._M_p,local_ac0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  if (local_378.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_378.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_870 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_870);
  }
  if (local_b00 != (element_type *)local_af0) {
    operator_delete(local_b00,local_af0._0_8_ + 1);
  }
  if (local_380 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_380);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b40._M_dataplus._M_p != &local_b40.field_2) {
    operator_delete(local_b40._M_dataplus._M_p,local_b40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b20._M_dataplus._M_p != &local_b20.field_2) {
    operator_delete(local_b20._M_dataplus._M_p,local_b20.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
  }
  if (local_358.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_358.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_860 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_860);
  }
  if (local_b60[0] != local_b50) {
    operator_delete(local_b60[0],local_b50[0] + 1);
  }
  if (local_360 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_360);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b80._M_dataplus._M_p != &local_b80.field_2) {
    operator_delete(local_b80._M_dataplus._M_p,local_b80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bc0._M_dataplus._M_p != &local_bc0.field_2) {
    operator_delete(local_bc0._M_dataplus._M_p,local_bc0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  if (local_338.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_338.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_850 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_850);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba0._M_dataplus._M_p != &local_ba0.field_2) {
    operator_delete(local_ba0._M_dataplus._M_p,local_ba0.field_2._M_allocated_capacity + 1);
  }
  if (local_340 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_340);
  }
  if ((pointer)local_be8._0_8_ != pcVar1) {
    operator_delete((void *)local_be8._0_8_,local_be8._16_8_ + 1);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548._0_8_ !=
      &local_538) {
    operator_delete((void *)local_548._0_8_,(ulong)(local_538._M_dataplus._M_p + 1));
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9c0._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9a8) {
    operator_delete((void *)local_9c0._8_8_,(ulong)(local_9a8._0_8_ + 1));
  }
  if (local_a40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a30) {
    operator_delete(local_a40,CONCAT44(local_a30._4_4_,local_a30._0_4_) + 1);
  }
  local_ae0._M_dataplus._M_p._0_1_ = 1;
  local_aa0 = (long *)((ulong)local_aa0 & 0xffffffffffffff00);
  local_a20._M_allocated_capacity =
       (size_type)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a10;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_a30 + 0x10),"Help","");
  uVar6 = local_a10._0_4_;
  local_9c0._16_8_ = local_a20._8_8_;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_a20._M_allocated_capacity ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a10) {
    local_538._M_string_length._0_4_ = local_a10._8_4_;
    local_538._M_string_length._4_4_ = local_a10._12_4_;
    local_548._0_8_ = &local_538;
  }
  else {
    local_548._0_8_ = local_a20._M_allocated_capacity;
  }
  local_538._M_dataplus._M_p._4_4_ = local_a10._4_4_;
  local_538._M_dataplus._M_p._0_4_ = local_a10._0_4_;
  local_548._8_8_ = local_a20._8_8_;
  local_a20._8_8_ = 0;
  local_a10._0_4_ = local_a10._0_4_ & 0xffffff00;
  local_9c0._0_8_ = local_150;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548._0_8_ ==
      &local_538) {
    local_9a8._0_8_ = CONCAT44(local_a10._4_4_,uVar6);
    local_9a8._12_4_ = local_538._M_string_length._4_4_;
    local_9a8._8_4_ = (undefined4)local_538._M_string_length;
    local_9c0._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9a8
    ;
  }
  else {
    local_9c0._8_8_ = local_548._0_8_;
    local_9a8._0_8_ = local_538._M_dataplus._M_p;
  }
  local_a20._M_allocated_capacity =
       (size_type)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a10;
  local_548._0_8_ = &local_538;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"h,help","");
  local_be8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_be8,"Print usage","");
  cxxopts::value<bool>((cxxopts *)&local_b40,(bool *)(local_af0 + 0x10));
  _Var3._M_p = local_b40._M_dataplus._M_p;
  local_ba0._M_dataplus._M_p = (pointer)&local_ba0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ba0,"false","");
  (**(code **)(*(size_type *)_Var3._M_p + 0x50))(&local_b20,_Var3._M_p,&local_ba0);
  local_478.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_b20._M_dataplus._M_p;
  local_478.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b20._M_string_length;
  local_b20._M_dataplus._M_p = (pointer)0x0;
  local_b20._M_string_length = 0;
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
  pOVar8 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)local_9c0,(string *)local_548,(string *)local_be8,&local_478,
                      &local_2d0);
  local_bc0._M_dataplus._M_p = (pointer)&local_bc0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bc0,"v,version","");
  local_b80._M_dataplus._M_p = (pointer)&local_b80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b80,"Print version","");
  cxxopts::value<bool>((cxxopts *)&local_ac0,(bool *)&local_aa0);
  _Var3._M_p = local_ac0._M_dataplus._M_p;
  local_b60[0] = local_b50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b60,"false","");
  (**(code **)(*(size_type *)_Var3._M_p + 0x50))(&local_b00,_Var3._M_p,local_b60);
  local_488.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_b00;
  local_488.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_af8;
  local_b00 = (element_type *)0x0;
  p_Stack_af8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"");
  cxxopts::OptionAdder::operator()(pOVar8,&local_bc0,&local_b80,&local_488,&local_2f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if (local_488.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_488.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_af8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_af8);
  }
  if (local_b60[0] != local_b50) {
    operator_delete(local_b60[0],local_b50[0] + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ac0._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ac0._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b80._M_dataplus._M_p != &local_b80.field_2) {
    operator_delete(local_b80._M_dataplus._M_p,local_b80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bc0._M_dataplus._M_p != &local_bc0.field_2) {
    operator_delete(local_bc0._M_dataplus._M_p,local_bc0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_ba0.field_2;
  if (local_478.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_478.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b20._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b20._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba0._M_dataplus._M_p != paVar2) {
    operator_delete(local_ba0._M_dataplus._M_p,local_ba0.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b40._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b40._M_string_length);
  }
  if ((pointer)local_be8._0_8_ != pcVar1) {
    operator_delete((void *)local_be8._0_8_,local_be8._16_8_ + 1);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548._0_8_ !=
      &local_538) {
    operator_delete((void *)local_548._0_8_,(ulong)(local_538._M_dataplus._M_p + 1));
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9c0._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9a8) {
    operator_delete((void *)local_9c0._8_8_,(ulong)(local_9a8._0_8_ + 1));
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_a20._M_allocated_capacity !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a10) {
    operator_delete((void *)local_a20._M_allocated_capacity,
                    CONCAT44(local_a10._4_4_,local_a10._0_4_) + 1);
  }
  local_be8._0_8_ = local_c8;
  local_be8._8_8_ = local_c0._M_pi;
  if (local_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_c0._M_pi)->_M_use_count = (local_c0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_c0._M_pi)->_M_use_count = (local_c0._M_pi)->_M_use_count + 1;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_9c0,local_b8);
  cxxopts::ParseResult::ParseResult
            ((ParseResult *)local_548,
             (shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>_>
              *)local_be8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_9c0,local_cf,&local_a7c,&local_2f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_9c0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_be8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_be8._8_8_);
  }
  if (local_9e0._8_8_ == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Please provide an input file",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
  }
  bVar14 = true;
  if ((char)local_ae0._M_dataplus._M_p == '\0') {
    local_ba0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ba0,"help","");
    sVar9 = cxxopts::ParseResult::count((ParseResult *)local_548,&local_ba0);
    bVar14 = sVar9 != 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ba0._M_dataplus._M_p != paVar2) {
      operator_delete(local_ba0._M_dataplus._M_p,local_ba0.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar14) {
    local_170[0] = local_160;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_170,"-i input_directory -o output_directory -r username/repository",
               "");
    std::__cxx11::string::operator=((string *)(local_150 + 0x40),(string *)local_170);
    if (local_170[0] != local_160) {
      operator_delete(local_170[0],local_160[0] + 1);
    }
    local_9c0._0_8_ = local_9c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9c0,"File","");
    local_9a8._8_8_ = local_998 + 8;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_9a8 + 8),"Behaviour","");
    pbVar13 = &local_970;
    local_980[0] = (size_type)pbVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_980,"Help","");
    __l._M_len = 3;
    __l._M_array = (iterator)local_9c0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_bc0,__l,(allocator_type *)&local_b80);
    cxxopts::Options::help
              ((string *)local_be8,(Options *)local_150,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_bc0);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_be8._0_8_,local_be8._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((element_type *)local_be8._0_8_ != (element_type *)(local_be8 + 0x10)) {
      operator_delete((void *)local_be8._0_8_,local_be8._16_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_bc0);
    lVar12 = -0x60;
    do {
      if (pbVar13 !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          pbVar13[-1].field_2._M_allocated_capacity) {
        operator_delete((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        pbVar13[-1].field_2._M_allocated_capacity,
                        (ulong)((pbVar13->_M_dataplus)._M_p + 1));
      }
      pbVar13 = pbVar13 + -1;
      lVar12 = lVar12 + 0x20;
    } while (lVar12 != 0);
    uVar7 = (uint)(local_9e0._8_8_ == 0);
  }
  else if (local_aa0._0_1_ == (cxxopts)0x1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"mdsplit: version 0.0.1",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    uVar7 = 0;
    std::ostream::flush();
  }
  else {
    mdsplit::mdsplitter::mdsplitter((mdsplitter *)local_9c0);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)local_be8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_9f0 + 0x10),auto_format);
    mdsplit::mdsplitter::input((mdsplitter *)local_9c0,(path *)local_be8);
    std::filesystem::__cxx11::path::~path((path *)local_be8);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)local_be8,&local_848,auto_format);
    mdsplit::mdsplitter::output_dir((mdsplitter *)local_9c0,(path *)local_be8);
    std::filesystem::__cxx11::path::~path((path *)local_be8);
    mdsplit::mdsplitter::repository((mdsplitter *)local_9c0,&local_568);
    mdsplit::mdsplitter::max_split_level((mdsplitter *)local_9c0,local_bea);
    pbVar5 = local_a78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar4 = local_a78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_a78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_a78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar11 = (long)local_a78.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_a78.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar12 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_a78.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_a78.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar4,pbVar5);
    }
    __first = std::
              __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                        (local_a78.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_a78.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_a78,(iterator)__first._M_current,
               (iterator)
               local_a78.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    mdsplit::mdsplitter::clear_html_tags((mdsplitter *)local_9c0,&local_a78);
    mdsplit::mdsplitter::include_toc((mdsplitter *)local_9c0,local_beb);
    mdsplit::mdsplitter::jekyll_escape((mdsplitter *)local_9c0,local_bec);
    mdsplit::mdsplitter::indent_headers((mdsplitter *)local_9c0,local_bed);
    mdsplit::mdsplitter::add_front_matter((mdsplitter *)local_9c0,local_bee);
    mdsplit::mdsplitter::update_links((mdsplitter *)local_9c0,local_bef);
    mdsplit::mdsplitter::remove_autotoc((mdsplitter *)local_9c0,local_bf0);
    mdsplit::mdsplitter::trace((mdsplitter *)local_9c0,local_bf1);
    mdsplit::mdsplitter::erase_old_mdsplit_files((mdsplitter *)local_9c0,local_bf2);
    uVar7 = mdsplit::mdsplitter::run((mdsplitter *)local_9c0);
    std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::~vector(&local_900);
    std::filesystem::__cxx11::path::~path(&local_928);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_970.field_2._8_8_ != local_948) {
      operator_delete((void *)local_970.field_2._8_8_,local_948[0]._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_970);
    std::filesystem::__cxx11::path::~path((path *)local_998);
    std::filesystem::__cxx11::path::~path((path *)local_9c0);
  }
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_4a0);
  std::
  _Hashtable<std::shared_ptr<cxxopts::OptionDetails>,_std::pair<const_std::shared_ptr<cxxopts::OptionDetails>,_cxxopts::OptionValue>,_std::allocator<std::pair<const_std::shared_ptr<cxxopts::OptionDetails>,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<cxxopts::OptionDetails>_>,_std::hash<std::shared_ptr<cxxopts::OptionDetails>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_4e0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_518);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_538);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_548._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_548._8_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,
                    CONCAT71(local_568.field_2._M_allocated_capacity._1_7_,
                             local_568.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848._M_dataplus._M_p != &local_848.field_2) {
    operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e0._M_allocated_capacity != &local_9d0) {
    operator_delete((void *)local_9e0._M_allocated_capacity,local_9d0._M_allocated_capacity + 1);
  }
  cxxopts::Options::~Options((Options *)local_150);
  return uVar7;
}

Assistant:

int main(int argc, char *argv[]) {
    ///////////////////////////////////////////////////////
    /// Define command line options                     ///
    ///////////////////////////////////////////////////////
    cxxopts::Options options("mdsplit",
                             "Generate documentation from README.md files");
    std::string input = "README.md";
    std::string output = "docs";
    std::string repository;
    options.add_options("File")(
        "i,input", "Input file",
        cxxopts::value(input)->default_value("README.md"))(
        "o,output", "Output directory",
        cxxopts::value(output)->default_value("docs"))(
        "r,repository", "Output repository", cxxopts::value(repository));

    short max_split_level{6};
    std::vector<std::string> clear_html_tags{};
    bool include_toc{false};
    bool jekyll_escape{true};
    bool indent_headers{true};
    bool add_front_matter{true};
    bool update_links{true};
    bool remove_autotoc{true};
    bool trace{true};
    bool erase_old_mdsplit_files{true};
    options.add_options("Behaviour")(
        "l,level", "Max level for which we should split the file",
        cxxopts::value(max_split_level)->default_value("6"))(
        "c,clear-html", "List of HTML tags mdsplit should clear",
        cxxopts::value(clear_html_tags)->default_value("details,summary"))(
        "t,toc", "Create a table of contents for the new files",
        cxxopts::value(include_toc)->default_value("false"))(
        "e,erase-old-mdsplit-files",
        "Erase old md files also generated with mdsplit",
        cxxopts::value(erase_old_mdsplit_files)->default_value("true"))(
        "j,jekyll-escape", "Escape consecutive \"{{\"s for Jekyll processing",
        cxxopts::value(jekyll_escape)->default_value("true"))(
        "header-reindent", "Reindent headers to match the new files",
        cxxopts::value(indent_headers)->default_value("true"))(
        "f,front-matter", "Include a front-matter in the new files",
        cxxopts::value(add_front_matter)->default_value("true"))(
        "u,url-update", "Update relative URLs to their new relative paths",
        cxxopts::value(update_links)->default_value("true"))(
        "remove-auto-toc", "Remove automatic table of contents",
        cxxopts::value(remove_autotoc)->default_value("true"))(
        "trace", "Trace commands",
        cxxopts::value(trace)->default_value("true"));

    bool show_help{true};
    bool show_version{false};
    options.add_options("Help")(
        "h,help", "Print usage",
        cxxopts::value(show_help)->default_value("false"))(
        "v,version", "Print version",
        cxxopts::value(show_version)->default_value("false"));

    ///////////////////////////////////////////////////////
    /// Parse command line options                      ///
    ///////////////////////////////////////////////////////
    auto result = options.parse(argc, argv);

    if (input.empty()) {
        std::cerr << "Please provide an input file" << std::endl;
    }

    if (show_help || result.count("help")) {
        options.custom_help(
            "-i input_directory -o output_directory -r username/repository");
        std::cout << options.help({"File", "Behaviour", "Help"}) << std::endl;
        return input.empty() ? 1 : 0;
    }

    // Show version
    if (show_version) {
        std::cout << "mdsplit: version 0.0.1" << std::endl;
        return 0;
    }

    ///////////////////////////////////////////////////////
    /// Run                                             ///
    ///////////////////////////////////////////////////////
    mdsplit::mdsplitter m;
    m.input(input);
    m.output_dir(output);
    m.repository(repository);
    m.max_split_level(max_split_level);
    std::sort(clear_html_tags.begin(), clear_html_tags.end());
    clear_html_tags.erase(
        std::unique(clear_html_tags.begin(), clear_html_tags.end()),
        clear_html_tags.end());
    m.clear_html_tags(clear_html_tags);
    m.include_toc(include_toc);
    m.jekyll_escape(jekyll_escape);
    m.indent_headers(indent_headers);
    m.add_front_matter(add_front_matter);
    m.update_links(update_links);
    m.remove_autotoc(remove_autotoc);
    m.trace(trace);
    m.erase_old_mdsplit_files(erase_old_mdsplit_files);
    return m.run();
}